

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTable.h
# Opt level: O0

void __thiscall SGParser::ParseTable::~ParseTable(ParseTable *this)

{
  ParseTable *this_local;
  
  Destroy(this);
  std::
  vector<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
  ::~vector(&this->ReduceProductions);
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::~vector(&this->GotoTable);
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::~vector(&this->ActionTable);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map(&this->ProductionErrorTerminals);
  std::vector<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>::
  ~vector(&this->StateInfos);
  std::vector<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>::
  ~vector(&this->Terminals);
  std::vector<SGParser::ParseTable::NonTerminal,_std::allocator<SGParser::ParseTable::NonTerminal>_>
  ::~vector(&this->NonTerminals);
  return;
}

Assistant:

~ParseTable() { Destroy(); }